

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O3

void __thiscall
QGraphicsAnchorLayoutPrivate::restoreSimplifiedConstraints
          (QGraphicsAnchorLayoutPrivate *this,ParallelAnchorData *parallel)

{
  QSimplexVariable *pQVar1;
  QSimplexConstraint *pQVar2;
  AnchorVertex *pAVar3;
  AnchorVertex *pAVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  qreal v;
  Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *local_58;
  TryEmplaceResult local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((parallel->super_AnchorData).field_0x78 & 8) != 0) {
    if ((parallel->m_firstConstraints).d.size != 0) {
      pQVar1 = &(parallel->super_AnchorData).super_QSimplexVariable;
      uVar5 = 0;
      do {
        pQVar2 = (parallel->m_firstConstraints).d.ptr[uVar5];
        local_58 = (Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *)pQVar1;
        QHash<QSimplexVariable*,double>::tryEmplace_impl<QSimplexVariable*const&>
                  (&local_50,(QHash<QSimplexVariable*,double> *)pQVar2,
                   (QSimplexVariable **)&local_58);
        local_58 = *(Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> **)
                    ((local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].entries
                     [(local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].offsets
                      [(uint)local_50.iterator.i.bucket & 0x7f]].storage.data + 8);
        local_50.iterator.i.d = (Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *)pQVar1;
        QHash<QSimplexVariable*,double>::removeImpl<QSimplexVariable*>
                  ((QHash<QSimplexVariable*,double> *)pQVar2,(QSimplexVariable **)&local_50);
        local_50.iterator.i.d =
             (Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *)
             &parallel->firstEdge->super_QSimplexVariable;
        if (parallel->firstEdge == (AnchorData *)0x0) {
          local_50.iterator.i.d = (Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *)0x0;
        }
        QHash<QSimplexVariable*,double>::emplace<double_const&>
                  ((QHash<QSimplexVariable*,double> *)pQVar2,(QSimplexVariable **)&local_50,
                   (double *)&local_58);
        uVar5 = uVar5 + 1;
      } while (uVar5 < (ulong)(parallel->m_firstConstraints).d.size);
    }
    if ((parallel->m_secondConstraints).d.size != 0) {
      pAVar3 = parallel->firstEdge->from;
      pAVar4 = parallel->secondEdge->from;
      pQVar1 = &(parallel->super_AnchorData).super_QSimplexVariable;
      uVar5 = 0;
      do {
        pQVar2 = (parallel->m_secondConstraints).d.ptr[uVar5];
        local_58 = (Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *)pQVar1;
        QHash<QSimplexVariable*,double>::tryEmplace_impl<QSimplexVariable*const&>
                  (&local_50,(QHash<QSimplexVariable*,double> *)pQVar2,
                   (QSimplexVariable **)&local_58);
        local_58 = *(Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> **)
                    ((local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].entries
                     [(local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].offsets
                      [(uint)local_50.iterator.i.bucket & 0x7f]].storage.data + 8);
        if (pAVar3 != pAVar4) {
          local_58 = (Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *)
                     ((ulong)local_58 ^ 0x8000000000000000);
        }
        local_50.iterator.i.d = (Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *)pQVar1;
        QHash<QSimplexVariable*,double>::removeImpl<QSimplexVariable*>
                  ((QHash<QSimplexVariable*,double> *)pQVar2,(QSimplexVariable **)&local_50);
        local_50.iterator.i.d =
             (Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *)
             &parallel->secondEdge->super_QSimplexVariable;
        if (parallel->secondEdge == (AnchorData *)0x0) {
          local_50.iterator.i.d = (Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *)0x0;
        }
        QHash<QSimplexVariable*,double>::emplace<double_const&>
                  ((QHash<QSimplexVariable*,double> *)pQVar2,(QSimplexVariable **)&local_50,
                   (double *)&local_58);
        uVar5 = uVar5 + 1;
      } while (uVar5 < (ulong)(parallel->m_secondConstraints).d.size);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsAnchorLayoutPrivate::restoreSimplifiedConstraints(ParallelAnchorData *parallel)
{
    if (!parallel->isCenterAnchor)
        return;

    for (int i = 0; i < parallel->m_firstConstraints.size(); ++i) {
        QSimplexConstraint *c = parallel->m_firstConstraints.at(i);
        qreal v = c->variables[parallel];
        c->variables.remove(parallel);
        c->variables.insert(parallel->firstEdge, v);
    }

    // When restoring, we might have to revert constraints back. See comments on
    // addAnchorMaybeParallel().
    const bool needsReverse = !parallel->secondForward();

    for (int i = 0; i < parallel->m_secondConstraints.size(); ++i) {
        QSimplexConstraint *c = parallel->m_secondConstraints.at(i);
        qreal v = c->variables[parallel];
        if (needsReverse)
            v *= -1;
        c->variables.remove(parallel);
        c->variables.insert(parallel->secondEdge, v);
    }
}